

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O3

void __thiscall
CVmObjFrameRef::load_image_data(CVmObjFrameRef *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  ushort uVar1;
  ushort uVar2;
  vm_frameref_ext *pvVar3;
  char *buf;
  uint uVar4;
  vm_val_t *val;
  
  uVar1 = *(ushort *)ptr;
  uVar2 = *(ushort *)(ptr + 2);
  pvVar3 = alloc_ext(this,(uint)uVar1,(uint)uVar2);
  pvVar3->fp = (vm_val_t *)0x0;
  (pvVar3->entry).typ = (int)ptr[4];
  vmb_get_dh_val(ptr + 4,&pvVar3->entry);
  CVmObjTable::request_post_load_init(&G_obj_table_X,self);
  (pvVar3->self).typ = (int)ptr[9];
  vmb_get_dh_val(ptr + 9,&pvVar3->self);
  pvVar3->defobj = *(vm_obj_id_t *)(ptr + 0xe);
  pvVar3->targobj = *(vm_obj_id_t *)(ptr + 0x12);
  pvVar3->targprop = *(vm_prop_id_t *)(ptr + 0x16);
  (pvVar3->invokee).typ = (int)ptr[0x18];
  vmb_get_dh_val(ptr + 0x18,&pvVar3->invokee);
  if ((uint)uVar2 + (uint)uVar1 != 0) {
    val = pvVar3->vars;
    buf = ptr + 0x1d;
    uVar4 = (uint)uVar2 + (uint)uVar1 + 1;
    do {
      val->typ = (int)*buf;
      vmb_get_dh_val(buf,val);
      buf = buf + 5;
      val = val + 1;
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  return;
}

Assistant:

void CVmObjFrameRef::load_image_data(VMG_ vm_obj_id_t self,
                                     const char *ptr, size_t siz)
{
    /* read the number of variables */
    int nlocals = osrp2(ptr);
    int nparams = osrp2(ptr+2);
    ptr += 4;

    /* allocate the extension */
    vm_frameref_ext *ext = alloc_ext(vmg_ nlocals, nparams);

    /* 
     *   Since stack frames are inherently transient, a saved frame ref
     *   object can't point back to a live stack frame, so on restore we have
     *   to assume that our stack frame is inactive.  
     */
    ext->fp = 0;

    /* load the entry pointer */
    vmb_get_dh(ptr, &ext->entry);
    ptr += VMB_DATAHOLDER;

    /* after other objects are loaded, resolve the entry pointer */
    G_obj_table->request_post_load_init(self);

    /* load the method context variables */
    vmb_get_dh(ptr, &ext->self);
    ptr += VMB_DATAHOLDER;

    ext->defobj = vmb_get_objid(ptr);
    ptr += VMB_OBJECT_ID;

    ext->targobj = vmb_get_objid(ptr);
    ptr += VMB_OBJECT_ID;

    ext->targprop = vmb_get_propid(ptr);
    ptr += VMB_PROP_ID;

    vmb_get_dh(ptr, &ext->invokee);
    ptr += VMB_DATAHOLDER;

    /* read the variable snapshot values */
    int i;
    vm_val_t *v;
    for (i = nlocals + nparams, v = ext->vars ; i > 0 ; --i, ++v)
    {
        vmb_get_dh(ptr, v);
        ptr += VMB_DATAHOLDER;
    }
}